

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
CheckPackageMempoolAcceptResult_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Package *txns,PackageMempoolAcceptResult *result,
          bool expect_valid,CTxMemPool *mempool)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 *puVar2;
  pointer pcVar3;
  ModeState MVar4;
  ResultType RVar5;
  ResultType RVar6;
  char *pcVar7;
  pointer psVar8;
  element_type *peVar9;
  element_type *peVar10;
  _List_node_base *p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  _Alloc_hider _Var17;
  _Alloc_hider _Var18;
  _Alloc_hider _Var19;
  _Alloc_hider _Var20;
  _Alloc_hider _Var21;
  _Alloc_hider _Var22;
  char *pcVar23;
  const_iterator cVar24;
  mapped_type *pmVar25;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  CTxMemPool *args_1;
  _List_node_base *p_Var26;
  pointer psVar27;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range3;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *plVar28;
  Wtxid *__k;
  long in_FS_OFFSET;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  initializer_list<uint256> __l;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
  cluster;
  undefined1 local_b9 [9];
  undefined1 local_b0;
  undefined1 local_a8 [32];
  uchar uStack_88;
  string local_78;
  string local_58;
  long local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(in_register_00000009,expect_valid);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MVar4 = (result->m_state).super_ValidationState<PackageValidationResult>.m_mode;
  if ((int)args == 0) {
    if (MVar4 != M_VALID) goto LAB_0084e066;
    ValidationState<PackageValidationResult>::ToString_abi_cxx11_
              (&local_58,(ValidationState<PackageValidationResult> *)result);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_a8,(tinyformat *)"Package validation unexpectedly succeeded. %s",
               (char *)&local_58,args);
  }
  else {
    if (MVar4 != M_INVALID) {
LAB_0084e066:
      if ((result->m_state).super_ValidationState<PackageValidationResult>.m_result != PCKG_POLICY)
      {
        pcVar23 = (char *)((long)(txns->
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(txns->
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 4);
        pcVar7 = (char *)(result->m_tx_results)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (pcVar23 != pcVar7) {
          local_78._M_dataplus._M_p = pcVar7;
          local_58._M_dataplus._M_p = pcVar23;
          tinyformat::format<unsigned_long,unsigned_long>
                    ((string *)local_a8,
                     (tinyformat *)"txns size %u does not match tx results size %u",
                     (char *)&local_58,(unsigned_long *)&local_78,(unsigned_long *)mempool);
          puVar2 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = puVar2;
          _Var22._M_p._1_7_ = local_a8._1_7_;
          _Var22._M_p._0_1_ = local_a8[0];
          pcVar3 = local_a8 + 0x10;
          if (_Var22._M_p == pcVar3) {
            *puVar2 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = _Var22._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
          local_a8[0] = SUB81(pcVar3,0);
          local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
          local_a8[8] = '\0';
          local_a8[9] = '\0';
          local_a8[10] = '\0';
          local_a8[0xb] = '\0';
          local_a8[0xc] = '\0';
          local_a8[0xd] = '\0';
          local_a8[0xe] = '\0';
          local_a8[0xf] = '\0';
          local_a8[0x10] = '\0';
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          goto LAB_0084ea8f;
        }
      }
      psVar27 = (txns->
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      psVar8 = (txns->
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar29 = psVar27 == psVar8;
      if (!bVar29) {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(__return_storage_ptr__->
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_payload + 0x10);
        args_1 = mempool;
        do {
          peVar9 = (psVar27->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          __k = &peVar9->m_witness_hash;
          cVar24 = std::
                   _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   ::find(&(result->m_tx_results)._M_t,&__k->m_wrapped);
          if ((_Rb_tree_header *)cVar24._M_node ==
              &(result->m_tx_results)._M_t._M_impl.super__Rb_tree_header) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            tinyformat::format<std::__cxx11::string>
                      ((string *)local_a8,(tinyformat *)"result not found for tx %s",
                       (char *)&local_58,args);
            goto LAB_0084e3ee;
          }
          pmVar25 = std::
                    map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    ::at(&result->m_tx_results,&__k->m_wrapped);
          RVar5 = pmVar25->m_result_type;
          if ((expect_valid) &&
             ((pmVar25->m_state).super_ValidationState<TxValidationResult>.m_mode == M_INVALID)) {
            base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
            ValidationState<TxValidationResult>::ToString_abi_cxx11_
                      (&local_78,&(pmVar25->m_state).super_ValidationState<TxValidationResult>);
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((string *)local_a8,(tinyformat *)"tx %s unexpectedly failed: %s",
                       (char *)&local_58,&local_78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            pcVar3 = local_a8 + 0x10;
            *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &(__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload = pbVar1;
            _Var16._M_p._1_7_ = local_a8._1_7_;
            _Var16._M_p._0_1_ = local_a8[0];
            if (_Var16._M_p == pcVar3) {
              (pbVar1->_M_dataplus)._M_p = (pointer)CONCAT71(local_a8._17_7_,local_a8[0x10]);
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
            }
            else {
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p = _Var16._M_p;
              *(ulong *)((long)&(__return_storage_ptr__->
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                )._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
            }
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
            local_a8[0] = SUB81(pcVar3,0);
            local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
            local_a8[8] = '\0';
            local_a8[9] = '\0';
            local_a8[10] = '\0';
            local_a8[0xb] = '\0';
            local_a8[0xc] = '\0';
            local_a8[0xd] = '\0';
            local_a8[0xe] = '\0';
            local_a8[0xf] = '\0';
            local_a8[0x10] = '\0';
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged = true;
            args = pbVar1;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
LAB_0084e439:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
LAB_0084e45e:
            bVar30 = true;
          }
          else {
            if (100 < (pmVar25->m_replaced_transactions).
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      ._M_impl._M_node._M_size) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s result replaced too many transactions",
                         (char *)&local_58,args);
LAB_0084e3ee:
              *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               &(__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload = pbVar1;
              _Var17._M_p._1_7_ = local_a8._1_7_;
              _Var17._M_p._0_1_ = local_a8[0];
              pcVar3 = local_a8 + 0x10;
              if (_Var17._M_p == pcVar3) {
                (pbVar1->_M_dataplus)._M_p = (pointer)CONCAT71(local_a8._17_7_,local_a8[0x10]);
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
              }
              else {
                (__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p = _Var17._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
              }
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
              local_a8[0] = SUB81(pcVar3,0);
              local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
              local_a8[8] = '\0';
              local_a8[9] = '\0';
              local_a8[10] = '\0';
              local_a8[0xb] = '\0';
              local_a8[0xc] = '\0';
              local_a8[0xd] = '\0';
              local_a8[0xe] = '\0';
              local_a8[0xf] = '\0';
              local_a8[0x10] = '\0';
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged = true;
              args = pbVar1;
              goto LAB_0084e439;
            }
            plVar28 = &pmVar25->m_replaced_transactions;
            p_Var26 = (plVar28->
                      super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      )._M_impl._M_node.super__List_node_base._M_next;
            if (((p_Var26 != (_List_node_base *)plVar28) &&
                ((pmVar25->m_wtxids_fee_calculations).
                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                 ._M_engaged == true)) &&
               (args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)*(pointer *)
                               ((long)&(pmVar25->m_wtxids_fee_calculations).
                                       super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                       ._M_payload._M_value.
                                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                               + 8) -
                       *(long *)&(pmVar25->m_wtxids_fee_calculations).
                                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                 ._M_payload._M_value.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                 ._M_impl),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40 < args)) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s was part of a too-large package RBF subpackage",
                         (char *)&local_58,args);
              goto LAB_0084e3ee;
            }
            if ((mempool != (CTxMemPool *)0x0) && (p_Var26 != (_List_node_base *)plVar28)) {
              local_b0 = 0;
              local_b9._1_8_ = &mempool->cs;
              std::unique_lock<std::recursive_mutex>::lock
                        ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
              if (((pmVar25->m_wtxids_fee_calculations).
                   super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                   ._M_engaged != true) ||
                 ((long)*(pointer *)
                         ((long)&(pmVar25->m_wtxids_fee_calculations).
                                 super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                                 ._M_payload._M_value.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                         + 8) -
                  *(long *)&(pmVar25->m_wtxids_fee_calculations).
                            super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                            ._M_payload._M_value.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl != 0x40)) {
LAB_0084e320:
                std::unique_lock<std::recursive_mutex>::~unique_lock
                          ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
                goto LAB_0084e32e;
              }
              peVar10 = (psVar27->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              uVar12 = *(undefined8 *)
                        (peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar13 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar14 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
              uVar15 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
              local_a8[0x10] = (undefined1)uVar14;
              local_a8._17_7_ = (undefined7)((ulong)uVar14 >> 8);
              local_a8[0x18] = (undefined1)uVar15;
              local_a8._25_7_ = (undefined7)((ulong)uVar15 >> 8);
              local_a8[0] = (undefined1)uVar12;
              local_a8._1_7_ = (undefined7)((ulong)uVar12 >> 8);
              local_a8[8] = (undefined1)uVar13;
              local_a8._9_7_ = (undefined7)((ulong)uVar13 >> 8);
              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b9;
              __l._M_len = 1;
              __l._M_array = (iterator)local_a8;
              std::vector<uint256,_std::allocator<uint256>_>::vector
                        ((vector<uint256,_std::allocator<uint256>_> *)&local_58,__l,
                         (allocator_type *)args);
              CTxMemPool::GatherClusters
                        ((vector<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>
                          *)&local_78,mempool,(vector<uint256,_std::allocator<uint256>_> *)&local_58
                        );
              if (local_58._M_dataplus._M_p != (char *)0x0) {
                operator_delete(local_58._M_dataplus._M_p,
                                local_58.field_2._M_allocated_capacity -
                                (long)local_58._M_dataplus._M_p);
              }
              if (local_78._M_string_length - (long)local_78._M_dataplus._M_p == 0x10) {
                if (local_78._M_dataplus._M_p != (char *)0x0) {
                  operator_delete(local_78._M_dataplus._M_p,
                                  local_78.field_2._M_allocated_capacity -
                                  (long)local_78._M_dataplus._M_p);
                }
                goto LAB_0084e320;
              }
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_a8,
                         (tinyformat *)
                         "tx %s has too many ancestors or descendants for a package rbf",
                         (char *)&local_58,args);
              pcVar3 = local_a8 + 0x10;
              *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               &(__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload = pbVar1;
              _Var19._M_p._1_7_ = local_a8._1_7_;
              _Var19._M_p._0_1_ = local_a8[0];
              if (_Var19._M_p == pcVar3) {
                (pbVar1->_M_dataplus)._M_p = (pointer)CONCAT71(local_a8._17_7_,local_a8[0x10]);
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
              }
              else {
                (__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p = _Var19._M_p;
                *(ulong *)((long)&(__return_storage_ptr__->
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
              }
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
              local_a8[0] = SUB81(pcVar3,0);
              local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
              local_a8[8] = '\0';
              local_a8[9] = '\0';
              local_a8[10] = '\0';
              local_a8[0xb] = '\0';
              local_a8[0xc] = '\0';
              local_a8[0xd] = '\0';
              local_a8[0xe] = '\0';
              local_a8[0xf] = '\0';
              local_a8[0x10] = '\0';
              (__return_storage_ptr__->
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_engaged = true;
              args = pbVar1;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_78._M_dataplus._M_p != (char *)0x0) {
                operator_delete(local_78._M_dataplus._M_p,
                                local_78.field_2._M_allocated_capacity -
                                (long)local_78._M_dataplus._M_p);
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)(local_b9 + 1));
              goto LAB_0084e45e;
            }
LAB_0084e32e:
            bVar30 = RVar5 == VALID;
            RVar6 = pmVar25->m_result_type;
            bVar31 = RVar6 == MEMPOOL_ENTRY;
            if ((bVar31 || bVar30) !=
                (pmVar25->m_base_fees).super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (bVar31 || bVar30) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_base_fees",
                         (char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0084e3ee;
            }
            if ((bVar31 || bVar30) !=
                (pmVar25->m_vsize).super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (bVar31 || bVar30) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_vsize",
                         (char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0084e3ee;
            }
            if ((RVar6 == DIFFERENT_WITNESS) !=
                (pmVar25->m_other_wtxid).super__Optional_base<uint256,_true,_true>._M_payload.
                super__Optional_payload_base<uint256>._M_engaged) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (RVar6 == DIFFERENT_WITNESS) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,(tinyformat *)"tx %s result should %shave m_other_wtxid"
                         ,(char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0084e3ee;
            }
            args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT71((int7)((ulong)args >> 8),RVar6 == VALID);
            bVar30 = (pmVar25->m_state).super_ValidationState<TxValidationResult>.m_result ==
                     TX_RECONSIDERABLE || RVar6 == VALID;
            if ((pmVar25->m_effective_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload
                .super__Optional_payload_base<CFeeRate>._M_engaged != bVar30) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (RVar5 == VALID) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s result should %shave m_effective_feerate",
                         (char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0084e3ee;
            }
            if ((pmVar25->m_wtxids_fee_calculations).
                super__Optional_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>_>
                ._M_engaged != bVar30) {
              base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
              local_78._M_dataplus._M_p = "not ";
              if (RVar5 == VALID) {
                local_78._M_dataplus._M_p = "";
              }
              tinyformat::format<std::__cxx11::string,char_const*>
                        ((string *)local_a8,
                         (tinyformat *)"tx %s result should %shave m_effective_feerate",
                         (char *)&local_58,&local_78,(char **)args_1);
              goto LAB_0084e3ee;
            }
            if (mempool == (CTxMemPool *)0x0) {
LAB_0084e971:
              bVar30 = false;
            }
            else {
              peVar10 = (psVar27->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr;
              local_a8[0] = '\0';
              uVar12 = *(undefined8 *)
                        (peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar13 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar14 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
              uVar15 = *(undefined8 *)
                        ((long)(peVar10->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x18);
              local_a8._17_7_ = (undefined7)uVar14;
              local_a8[0x18] = (undefined1)((ulong)uVar14 >> 0x38);
              local_a8._25_7_ = (undefined7)uVar15;
              uStack_88 = (uchar)((ulong)uVar15 >> 0x38);
              local_a8._1_7_ = (undefined7)uVar12;
              local_a8[8] = (undefined1)((ulong)uVar12 >> 0x38);
              local_a8._9_7_ = (undefined7)uVar13;
              local_a8[0x10] = (undefined1)((ulong)uVar13 >> 0x38);
              bVar30 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
              if ((RVar6 != INVALID) == bVar30) {
                if ((((psVar27->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_has_witness == true) &&
                   (pmVar25->m_result_type == DIFFERENT_WITNESS)) {
                  local_a8[0] = '\x01';
                  uVar12 = *(undefined8 *)(__k->m_wrapped).super_base_blob<256U>.m_data._M_elems;
                  uVar13 = *(undefined8 *)
                            ((long)(peVar9->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar14 = *(undefined8 *)
                            ((long)(peVar9->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x10);
                  uVar15 = *(undefined8 *)
                            ((long)(peVar9->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  local_a8._17_7_ = (undefined7)uVar14;
                  local_a8[0x18] = (undefined1)((ulong)uVar14 >> 0x38);
                  local_a8._25_7_ = (undefined7)uVar15;
                  uStack_88 = (uchar)((ulong)uVar15 >> 0x38);
                  local_a8._1_7_ = (undefined7)uVar12;
                  local_a8[8] = (undefined1)((ulong)uVar12 >> 0x38);
                  local_a8._9_7_ = (undefined7)uVar13;
                  local_a8[0x10] = (undefined1)((ulong)uVar13 >> 0x38);
                  bVar30 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
                  if (bVar30) {
                    base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
                    tinyformat::format<std::__cxx11::string>
                              ((string *)local_a8,(tinyformat *)"wtxid %s should not be in mempool",
                               (char *)&local_58,args);
                    goto LAB_0084e60f;
                  }
                }
                p_Var26 = (plVar28->
                          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          )._M_impl._M_node.super__List_node_base._M_next;
                bVar30 = false;
                bVar31 = true;
                if (p_Var26 != (_List_node_base *)plVar28) {
                  do {
                    p_Var11 = p_Var26[1]._M_next;
                    local_a8[0] = '\0';
                    local_a8._17_7_ = (undefined7)*(undefined8 *)((long)(p_Var11 + 4) + 9);
                    local_a8[0x18] =
                         (undefined1)((ulong)*(undefined8 *)((long)(p_Var11 + 4) + 9) >> 0x38);
                    local_a8._25_7_ = (undefined7)*(undefined8 *)((long)(p_Var11 + 5) + 1);
                    uStack_88 = (uchar)((ulong)*(undefined8 *)((long)(p_Var11 + 5) + 1) >> 0x38);
                    local_a8._1_7_ = (undefined7)*(undefined8 *)((long)(p_Var11 + 3) + 9);
                    local_a8[8] = (undefined1)
                                  ((ulong)*(undefined8 *)((long)(p_Var11 + 3) + 9) >> 0x38);
                    local_a8._9_7_ = (undefined7)*(undefined8 *)((long)(p_Var11 + 4) + 1);
                    local_a8[0x10] =
                         (undefined1)((ulong)*(undefined8 *)((long)(p_Var11 + 4) + 1) >> 0x38);
                    bVar31 = CTxMemPool::exists(mempool,(GenTxid *)local_a8);
                    if (bVar31) {
                      base_blob<256u>::ToString_abi_cxx11_
                                (&local_58,(void *)((long)(p_Var26[1]._M_next + 5) + 9));
                      tinyformat::format<std::__cxx11::string>
                                ((string *)local_a8,
                                 (tinyformat *)"tx %s should not be in mempool as it was replaced",
                                 (char *)&local_58,args);
                      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                       &(__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload = pbVar1;
                      _Var20._M_p._1_7_ = local_a8._1_7_;
                      _Var20._M_p._0_1_ = local_a8[0];
                      pcVar3 = local_a8 + 0x10;
                      if (_Var20._M_p == pcVar3) {
                        (pbVar1->_M_dataplus)._M_p =
                             (pointer)CONCAT71(local_a8._17_7_,local_a8[0x10]);
                        *(ulong *)((long)&(__return_storage_ptr__->
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload + 0x18) =
                             CONCAT71(local_a8._25_7_,local_a8[0x18]);
                      }
                      else {
                        (__return_storage_ptr__->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._M_value._M_dataplus._M_p = _Var20._M_p;
                        *(ulong *)((long)&(__return_storage_ptr__->
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          )._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload + 0x10) =
                             CONCAT71(local_a8._17_7_,local_a8[0x10]);
                      }
                      (__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
                      local_a8[0] = SUB81(pcVar3,0);
                      local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
                      local_a8[8] = '\0';
                      local_a8[9] = '\0';
                      local_a8[10] = '\0';
                      local_a8[0xb] = '\0';
                      local_a8[0xc] = '\0';
                      local_a8[0xd] = '\0';
                      local_a8[0xe] = '\0';
                      local_a8[0xf] = '\0';
                      local_a8[0x10] = '\0';
                      (__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_engaged = true;
                      args = pbVar1;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_58._M_dataplus._M_p != &local_58.field_2) {
                        operator_delete(local_58._M_dataplus._M_p,
                                        local_58.field_2._M_allocated_capacity + 1);
                      }
                      if (bVar31) goto LAB_0084e961;
                    }
                    p_Var26 = p_Var26->_M_next;
                  } while (p_Var26 != (_List_node_base *)plVar28);
                  bVar31 = true;
                }
              }
              else {
                base_blob<256u>::ToString_abi_cxx11_(&local_58,__k);
                local_78._M_dataplus._M_p = "not ";
                if (RVar6 != INVALID) {
                  local_78._M_dataplus._M_p = "";
                }
                tinyformat::format<std::__cxx11::string,char_const*>
                          ((string *)local_a8,(tinyformat *)"tx %s should %sbe in mempool",
                           (char *)&local_58,&local_78,(char **)args_1);
LAB_0084e60f:
                *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 &(__return_storage_ptr__->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload = pbVar1;
                _Var18._M_p._1_7_ = local_a8._1_7_;
                _Var18._M_p._0_1_ = local_a8[0];
                pcVar3 = local_a8 + 0x10;
                if (_Var18._M_p == pcVar3) {
                  (pbVar1->_M_dataplus)._M_p = (pointer)CONCAT71(local_a8._17_7_,local_a8[0x10]);
                  *(ulong *)((long)&(__return_storage_ptr__->
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
                }
                else {
                  (__return_storage_ptr__->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p = _Var18._M_p;
                  *(ulong *)((long)&(__return_storage_ptr__->
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    )._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
                }
                (__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
                local_a8[0] = SUB81(pcVar3,0);
                local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
                local_a8[8] = '\0';
                local_a8[9] = '\0';
                local_a8[10] = '\0';
                local_a8[0xb] = '\0';
                local_a8[0xc] = '\0';
                local_a8[0xd] = '\0';
                local_a8[0xe] = '\0';
                local_a8[0xf] = '\0';
                local_a8[0x10] = '\0';
                (__return_storage_ptr__->
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged = true;
                args = pbVar1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  local_58.field_2._M_allocated_capacity + 1);
                }
LAB_0084e961:
                bVar30 = true;
                bVar31 = false;
              }
              if (bVar31) goto LAB_0084e971;
            }
          }
          if (bVar30) {
            if (!bVar29) goto LAB_0084ea8f;
            break;
          }
          psVar27 = psVar27 + 1;
          bVar29 = psVar27 == psVar8;
        } while (!bVar29);
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      goto LAB_0084ea8f;
    }
    ValidationState<PackageValidationResult>::ToString_abi_cxx11_
              (&local_58,(ValidationState<PackageValidationResult> *)result);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_a8,(tinyformat *)"Package validation unexpectedly failed: %s",
               (char *)&local_58,args);
  }
  puVar2 = (undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload = puVar2;
  pcVar3 = local_a8 + 0x10;
  _Var21._M_p._1_7_ = local_a8._1_7_;
  _Var21._M_p._0_1_ = local_a8[0];
  if (_Var21._M_p == pcVar3) {
    *puVar2 = CONCAT71(local_a8._17_7_,local_a8[0x10]);
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x18) = CONCAT71(local_a8._25_7_,local_a8[0x18]);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p = _Var21._M_p;
    *(ulong *)((long)&(__return_storage_ptr__->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 0x10) = CONCAT71(local_a8._17_7_,local_a8[0x10]);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = CONCAT71(local_a8._9_7_,local_a8[8]);
  local_a8[0] = SUB81(pcVar3,0);
  local_a8._1_7_ = (undefined7)((ulong)pcVar3 >> 8);
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  local_a8[0x10] = '\0';
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_0084ea8f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> CheckPackageMempoolAcceptResult(const Package& txns,
                                                           const PackageMempoolAcceptResult& result,
                                                           bool expect_valid,
                                                           const CTxMemPool* mempool)
{
    if (expect_valid) {
        if (result.m_state.IsInvalid()) {
            return strprintf("Package validation unexpectedly failed: %s", result.m_state.ToString());
        }
    } else {
        if (result.m_state.IsValid()) {
            return strprintf("Package validation unexpectedly succeeded. %s", result.m_state.ToString());
        }
    }
    if (result.m_state.GetResult() != PackageValidationResult::PCKG_POLICY && txns.size() != result.m_tx_results.size()) {
        return strprintf("txns size %u does not match tx results size %u", txns.size(), result.m_tx_results.size());
    }
    for (const auto& tx : txns) {
        const auto& wtxid = tx->GetWitnessHash();
        if (result.m_tx_results.count(wtxid) == 0) {
            return strprintf("result not found for tx %s", wtxid.ToString());
        }

        const auto& atmp_result = result.m_tx_results.at(wtxid);
        const bool valid{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID};
        if (expect_valid && atmp_result.m_state.IsInvalid()) {
            return strprintf("tx %s unexpectedly failed: %s", wtxid.ToString(), atmp_result.m_state.ToString());
        }

        // Each subpackage is allowed MAX_REPLACEMENT_CANDIDATES replacements (only checking individually here)
        if (atmp_result.m_replaced_transactions.size() > MAX_REPLACEMENT_CANDIDATES) {
            return strprintf("tx %s result replaced too many transactions",
                                wtxid.ToString());
        }

        // Replacements can't happen for subpackages larger than 2
        if (!atmp_result.m_replaced_transactions.empty() &&
            atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() > 2) {
             return strprintf("tx %s was part of a too-large package RBF subpackage",
                                wtxid.ToString());
        }

        if (!atmp_result.m_replaced_transactions.empty() && mempool) {
            LOCK(mempool->cs);
            // If replacements occurred and it used 2 transactions, this is a package RBF and should result in a cluster of size 2
            if (atmp_result.m_wtxids_fee_calculations.has_value() && atmp_result.m_wtxids_fee_calculations.value().size() == 2) {
                const auto cluster = mempool->GatherClusters({tx->GetHash()});
                if (cluster.size() != 2) return strprintf("tx %s has too many ancestors or descendants for a package rbf", wtxid.ToString());
            }
        }

        // m_vsize and m_base_fees should exist iff the result was VALID or MEMPOOL_ENTRY
        const bool mempool_entry{atmp_result.m_result_type == MempoolAcceptResult::ResultType::MEMPOOL_ENTRY};
        if (atmp_result.m_base_fees.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_base_fees", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }
        if (atmp_result.m_vsize.has_value() != (valid || mempool_entry)) {
            return strprintf("tx %s result should %shave m_vsize", wtxid.ToString(), valid || mempool_entry ? "" : "not ");
        }

        // m_other_wtxid should exist iff the result was DIFFERENT_WITNESS
        const bool diff_witness{atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS};
        if (atmp_result.m_other_wtxid.has_value() != diff_witness) {
            return strprintf("tx %s result should %shave m_other_wtxid", wtxid.ToString(), diff_witness ? "" : "not ");
        }

        // m_effective_feerate and m_wtxids_fee_calculations should exist iff the result was valid
        // or if the failure was TX_RECONSIDERABLE
        const bool valid_or_reconsiderable{atmp_result.m_result_type == MempoolAcceptResult::ResultType::VALID ||
                    atmp_result.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE};
        if (atmp_result.m_effective_feerate.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }
        if (atmp_result.m_wtxids_fee_calculations.has_value() != valid_or_reconsiderable) {
            return strprintf("tx %s result should %shave m_effective_feerate",
                                    wtxid.ToString(), valid ? "" : "not ");
        }

        if (mempool) {
            // The tx by txid should be in the mempool iff the result was not INVALID.
            const bool txid_in_mempool{atmp_result.m_result_type != MempoolAcceptResult::ResultType::INVALID};
            if (mempool->exists(GenTxid::Txid(tx->GetHash())) != txid_in_mempool) {
                return strprintf("tx %s should %sbe in mempool", wtxid.ToString(), txid_in_mempool ? "" : "not ");
            }
            // Additionally, if the result was DIFFERENT_WITNESS, we shouldn't be able to find the tx in mempool by wtxid.
            if (tx->HasWitness() && atmp_result.m_result_type == MempoolAcceptResult::ResultType::DIFFERENT_WITNESS) {
                if (mempool->exists(GenTxid::Wtxid(wtxid))) {
                    return strprintf("wtxid %s should not be in mempool", wtxid.ToString());
                }
            }
            for (const auto& tx_ref : atmp_result.m_replaced_transactions) {
                if (mempool->exists(GenTxid::Txid(tx_ref->GetHash()))) {
                    return strprintf("tx %s should not be in mempool as it was replaced", tx_ref->GetWitnessHash().ToString());
                }
            }
        }
    }
    return std::nullopt;
}